

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::BufferView::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  Handle<(vk::HandleType)8> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  VkResult result;
  int iVar5;
  Parameters *in_RCX;
  undefined1 local_58 [24];
  VkAllocationCallbacks *pVStack_40;
  Move<vk::Handle<(vk::HandleType)8>_> local_38;
  
  anon_unknown_1::Buffer::create(&local_38,env,(Resources *)params,in_RCX);
  pVVar4 = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar3 = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar2 = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_58._16_8_ = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_40 = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_58._0_8_ = local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_58._8_8_ =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       pVVar3;
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       pDVar2;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_58,env->vkd,env->device,
             (VkBuffer)
             (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal);
  if (local_58._16_4_ == 0) {
    iVar5 = 0x20;
  }
  else {
    iVar5 = 0;
    if (local_58._16_4_ != 0) {
      for (; ((uint)local_58._16_4_ >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
      }
    }
  }
  local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = local_58._0_8_;
  local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(local_38.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface.
                _4_4_,iVar5);
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
            (&this->memory,env,(Parameters *)&local_38);
  result = (*env->vkd->_vptr_DeviceInterface[0xc])
                     (env->vkd,env->device,
                      (this->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                      object.m_internal,
                      (this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                      object.m_internal,0);
  ::vk::checkResult(result,"env.vkd.bindBufferMemory(env.device, *buffer.object, *memory.object, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x2c7);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: buffer(env, params.buffer)
			, memory(env, getDeviceMemoryParameters(env, *buffer.object))
		{
			VK_CHECK(env.vkd.bindBufferMemory(env.device, *buffer.object, *memory.object, 0));
		}